

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void kj::(anonymous_namespace)::
     runWithStackLimit<kj::(anonymous_namespace)::TestCase1063::run()::__0>
               (size_t stackSize,anon_class_8_1_7c961949 *func)

{
  SourceLocation location;
  anon_class_8_1_7c961949 *func_00;
  bool bVar1;
  _func_void_ptr_void_ptr *__start_routine;
  Fault local_260;
  Fault f_3;
  int local_250;
  DebugExpression<int> local_24c;
  undefined1 local_248 [8];
  DebugComparison<int,_int> _kjCondition_3;
  Fault f_2;
  int local_218;
  DebugExpression<int> local_214;
  undefined1 local_210 [8];
  DebugComparison<int,_int> _kjCondition_2;
  pthread_t pStack_1e8;
  anon_class_1_0_00000001 start;
  pthread_t thread;
  Fault f_1;
  undefined1 local_1d0 [8];
  DebugComparison<int,_int_&> _kjCondition_1;
  bool local_19d;
  int local_19c;
  bool _kj_shouldLog;
  Type TStack_198;
  int setStackSizeRetval;
  undefined1 local_190 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>
  _kjDefer1027;
  Fault f;
  int local_170;
  DebugExpression<int> local_16c;
  undefined1 local_168 [8];
  DebugComparison<int,_int> _kjCondition;
  pthread_attr_t attr;
  SourceLocation local_108;
  SourceLocation local_e8;
  undefined8 local_d0;
  Promise<void> local_c8 [3];
  undefined1 local_b0 [8];
  WaitScope waitScope;
  EventLoop loop;
  anon_class_8_1_7c961949 *func_local;
  size_t stackSize_local;
  
  func_local = (anon_class_8_1_7c961949 *)stackSize;
  bVar1 = anon_unknown_0::isLibcContextHandlingKnownBroken();
  if (!bVar1) {
    EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
    WaitScope::WaitScope((WaitScope *)local_b0,(EventLoop *)&waitScope.runningStacksPool);
    func_00 = func_local;
    local_d0 = func;
    SourceLocation::SourceLocation
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,"runWithStackLimit",0x3f9,5);
    location.function = local_e8.function;
    location.fileName = local_e8.fileName;
    location.lineNumber = local_e8.lineNumber;
    location.columnNumber = local_e8.columnNumber;
    startFiber<kj::(anonymous_namespace)::runWithStackLimit<kj::(anonymous_namespace)::TestCase1063::run()::__0>(unsigned_long,kj::(anonymous_namespace)::TestCase1063::run()::__0&&)::_lambda(kj::WaitScope&)_1_>
              ((size_t)local_c8,(Type *)func_00,location);
    SourceLocation::SourceLocation
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,"runWithStackLimit",0x3f9,5);
    Promise<void>::wait(local_c8,local_b0);
    Promise<void>::~Promise(local_c8);
    WaitScope::~WaitScope((WaitScope *)local_b0);
    EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  }
  local_170 = 0;
  local_16c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_170);
  f.exception._4_4_ = pthread_attr_init((pthread_attr_t *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_168,&local_16c,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
              ((Fault *)&_kjDefer1027.maybeFunc.ptr.field_1.value,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x402,FAILED,"0 == pthread_attr_init(&attr)","_kjCondition,",
               (DebugComparison<int,_int> *)local_168);
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer1027.maybeFunc.ptr.field_1.value);
  }
  TStack_198.attr = (pthread_attr_t *)&_kjCondition.result;
  defer<kj::(anonymous_namespace)::runWithStackLimit<kj::(anonymous_namespace)::TestCase1063::run()::__0>(unsigned_long,kj::(anonymous_namespace)::TestCase1063::run()::__0&&)::_lambda()_1_>
            ((kj *)local_190,&stack0xfffffffffffffe68);
  local_19c = pthread_attr_setstacksize((pthread_attr_t *)&_kjCondition.result,(size_t)func_local);
  if (local_19c == 0x16) {
    local_19d = kj::_::Debug::shouldLog(WARNING);
    while (local_19d != false) {
      _kjCondition_1._32_8_ = __sysconf(0x4b);
      kj::_::Debug::log<char_const(&)[128],unsigned_long&,long,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x409,WARNING,
                 "\"This platform\'s pthread implementation does not support setting a small stack size. \" \"Skipping pthread-based stack overflow test.\", stackSize, PTHREAD_STACK_MIN, setStackSizeRetval"
                 ,(char (*) [128])
                  "This platform\'s pthread implementation does not support setting a small stack size. Skipping pthread-based stack overflow test."
                 ,(unsigned_long *)&func_local,(long *)&_kjCondition_1.result,&local_19c);
      local_19d = false;
    }
  }
  else {
    f_1.exception._0_4_ = 0;
    f_1.exception._4_4_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&f_1);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_1d0,
               (DebugExpression<int> *)((long)&f_1.exception + 4),&local_19c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int&>&>
                ((Fault *)&thread,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x40b,FAILED,"0 == setStackSizeRetval","_kjCondition,",
                 (DebugComparison<int,_int_&> *)local_1d0);
      kj::_::Debug::Fault::fatal((Fault *)&thread);
    }
    _kjCondition_2._31_1_ = 0;
    local_218 = 0;
    local_214 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_218);
    __start_routine =
         runWithStackLimit(unsigned_long,kj::(anonymous_namespace)::TestCase1063::run()::$_0&&)::
         {lambda(void*)#1}::operator_cast_to_function_pointer
                   ((_lambda_void___1_ *)&_kjCondition_2.field_0x1f);
    f_2.exception._4_4_ =
         pthread_create(&stack0xfffffffffffffe18,(pthread_attr_t *)&_kjCondition.result,
                        (__start_routine *)__start_routine,func);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_210,&local_214,(int *)((long)&f_2.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                ((Fault *)&_kjCondition_3.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x414,FAILED,
                 "0 == pthread_create(&thread, &attr, start, reinterpret_cast<void*>(&func))",
                 "_kjCondition,",(DebugComparison<int,_int> *)local_210);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_3.result);
    }
    local_250 = 0;
    local_24c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_250);
    f_3.exception._4_4_ = pthread_join(pStack_1e8,(void **)0x0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_248,&local_24c,(int *)((long)&f_3.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_248);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x415,FAILED,"0 == pthread_join(thread, nullptr)","_kjCondition,",
                 (DebugComparison<int,_int> *)local_248);
      kj::_::Debug::Fault::fatal(&local_260);
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1027:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>
               *)local_190);
  return;
}

Assistant:

void runWithStackLimit(size_t stackSize, Func&& func) {
  // We have a couple possible ways to test limited stacks.  We exercise all available methods, to
  // reduce the likelihood of breakage in less frequently tested configurations.
  //
  // Prefer testing stack limits with fibers first, because it manifests stack overflow failures
  // with a segmentation fault and stack, while pthreads just aborts without output.

#if KJ_USE_FIBERS
  if (!isLibcContextHandlingKnownBroken()) {
    EventLoop loop;
    WaitScope waitScope(loop);

    startFiber(stackSize,
        [&](WaitScope&) mutable {
      func();
    }).wait(waitScope);
  }
#endif

#if !_WIN32
  pthread_attr_t attr;
  KJ_REQUIRE(0 == pthread_attr_init(&attr));
  KJ_DEFER(KJ_REQUIRE(0 == pthread_attr_destroy(&attr)));

  auto setStackSizeRetval = pthread_attr_setstacksize(&attr, stackSize);
  if (setStackSizeRetval == EINVAL) {
    KJ_LOG(WARNING,
        "This platform's pthread implementation does not support setting a small stack size. "
        "Skipping pthread-based stack overflow test.", stackSize, PTHREAD_STACK_MIN, setStackSizeRetval);
  } else {
    KJ_REQUIRE(0 == setStackSizeRetval);
    pthread_t thread;
    auto start = [](void* startArg) -> void* {
      EventLoop loop;
      WaitScope waitScope(loop);
      auto startFunc = reinterpret_cast<decltype(&func)>(startArg);
      (*startFunc)();
      return nullptr;
    };
    KJ_REQUIRE(0 == pthread_create(&thread, &attr, start, reinterpret_cast<void*>(&func)));
    KJ_REQUIRE(0 == pthread_join(thread, nullptr));
  }
#endif
}